

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void __thiscall EDCircles::JoinArcs2(EDCircles *this)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  MyArc *pMVar4;
  MyArc *pMVar5;
  EDArcs *pEVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  double yc;
  double xc;
  double eTheta_00;
  double sTheta_00;
  bool bVar9;
  void *pvVar10;
  void *pvVar11;
  double *x_00;
  double *y_00;
  undefined8 *puVar12;
  undefined8 *puVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_2398;
  double coverage;
  double CircleFitError;
  double R_1;
  double YC;
  double XC;
  double eTheta;
  double sTheta;
  double ellipseFitError;
  EllipseEquation eq;
  int noPixelsSave;
  int Which;
  int CandidateArcNo;
  int j_1;
  int index;
  double maxDistanceBetweenEndpoints;
  double d2;
  double dStack_22e0;
  int which;
  double d;
  double dy;
  double dx;
  double diff;
  double radiusDiffThreshold;
  double minR;
  int j;
  bool extendedArc;
  double *y;
  double *x;
  int local_2290;
  int noPixels;
  int EY;
  int EX;
  int SY;
  int SX;
  int NoPixels;
  int Turn;
  double R;
  double EllipseFitError;
  EllipseEquation Eq;
  int local_2228;
  int iStack_2224;
  bool EllipseEqValid;
  int i_1;
  int noCandidateArcs;
  CandidateArc *candidateArcs;
  int i;
  bool *taken;
  MyArc *arcs;
  undefined1 local_21f8 [4];
  int noArcs;
  AngleSet angles;
  EDCircles *this_local;
  
  angles.overlapAmount = (double)this;
  AngleSet::AngleSet((AngleSet *)local_21f8);
  sortArc(this->edarcs2->arcs,this->edarcs2->noArcs);
  iVar1 = this->edarcs2->noArcs;
  pMVar4 = this->edarcs2->arcs;
  uVar14 = (ulong)iVar1;
  if ((long)uVar14 < 0) {
    uVar14 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar14);
  for (candidateArcs._4_4_ = 0; candidateArcs._4_4_ < iVar1;
      candidateArcs._4_4_ = candidateArcs._4_4_ + 1) {
    *(undefined1 *)((long)pvVar10 + (long)candidateArcs._4_4_) = 0;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)iVar1;
  uVar14 = SUB168(auVar7 * ZEXT816(0x10),0);
  if (SUB168(auVar7 * ZEXT816(0x10),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar14);
  local_2228 = 0;
  do {
    if (iVar1 <= local_2228) {
      if (pvVar10 != (void *)0x0) {
        operator_delete__(pvVar10);
      }
      if (pvVar11 != (void *)0x0) {
        operator_delete__(pvVar11);
      }
      return;
    }
    if ((*(byte *)((long)pvVar10 + (long)local_2228) & 1) == 0) {
      Eq.coeff[6]._7_1_ = 0;
      EllipseEquation::EllipseEquation((EllipseEquation *)&EllipseFitError);
      _NoPixels = pMVar4[local_2228].r;
      SX = pMVar4[local_2228].turn;
      SY = pMVar4[local_2228].noPixels;
      EX = pMVar4[local_2228].sx;
      EY = pMVar4[local_2228].sy;
      noPixels = pMVar4[local_2228].ex;
      local_2290 = pMVar4[local_2228].ey;
      x._4_4_ = pMVar4[local_2228].noPixels;
      x_00 = BufferManager::getX(this->bm);
      y_00 = BufferManager::getY(this->bm);
      memcpy(x_00,pMVar4[local_2228].x,(long)x._4_4_ << 3);
      memcpy(y_00,pMVar4[local_2228].y,(long)x._4_4_ << 3);
      AngleSet::clear((AngleSet *)local_21f8);
      AngleSet::set((AngleSet *)local_21f8,pMVar4[local_2228].sTheta,pMVar4[local_2228].eTheta);
      do {
        bVar8 = false;
        iStack_2224 = 0;
        minR._0_4_ = local_2228;
        while (minR._0_4_ = minR._0_4_ + 1, minR._0_4_ < iVar1) {
          if ((((*(byte *)((long)pvVar10 + (long)minR._0_4_) & 1) == 0) &&
              (pMVar4[minR._0_4_].segmentNo == pMVar4[local_2228].segmentNo)) &&
             (pMVar4[minR._0_4_].turn == SX)) {
            if (_NoPixels < pMVar4[minR._0_4_].r || _NoPixels == pMVar4[minR._0_4_].r) {
              local_2398 = _NoPixels;
            }
            else {
              local_2398 = pMVar4[minR._0_4_].r;
            }
            if ((ABS(_NoPixels - pMVar4[minR._0_4_].r) <= local_2398 * 2.5) &&
               (dVar15 = AngleSet::overlap((AngleSet *)local_21f8,pMVar4[minR._0_4_].sTheta,
                                           pMVar4[minR._0_4_].eTheta), dVar15 < 0.75)) {
              dVar15 = (double)(EX - pMVar4[minR._0_4_].sx);
              dVar16 = (double)(EY - pMVar4[minR._0_4_].sy);
              dStack_22e0 = sqrt(dVar15 * dVar15 + dVar16 * dVar16);
              d2._4_4_ = 1;
              dVar15 = (double)(EX - pMVar4[minR._0_4_].ex);
              dVar16 = (double)(EY - pMVar4[minR._0_4_].ey);
              dVar15 = sqrt(dVar15 * dVar15 + dVar16 * dVar16);
              if (dVar15 < dStack_22e0) {
                d2._4_4_ = 2;
                dStack_22e0 = dVar15;
              }
              dVar15 = (double)(noPixels - pMVar4[minR._0_4_].sx);
              dVar16 = (double)(local_2290 - pMVar4[minR._0_4_].sy);
              dVar15 = sqrt(dVar15 * dVar15 + dVar16 * dVar16);
              if (dVar15 < dStack_22e0) {
                d2._4_4_ = 3;
                dStack_22e0 = dVar15;
              }
              dVar15 = (double)(noPixels - pMVar4[minR._0_4_].ex);
              dVar16 = (double)(local_2290 - pMVar4[minR._0_4_].ey);
              dVar15 = sqrt(dVar15 * dVar15 + dVar16 * dVar16);
              if (dVar15 < dStack_22e0) {
                d2._4_4_ = 4;
                dStack_22e0 = dVar15;
              }
              iVar2 = iStack_2224;
              if (dStack_22e0 <= 5.0) {
                while ((CandidateArcNo = iVar2 + -1, -1 < CandidateArcNo &&
                       (dStack_22e0 <= *(double *)((long)pvVar11 + (long)CandidateArcNo * 0x10 + 8))
                       )) {
                  puVar13 = (undefined8 *)((long)pvVar11 + (long)CandidateArcNo * 0x10);
                  puVar12 = (undefined8 *)((long)pvVar11 + (long)iVar2 * 0x10);
                  *puVar12 = *puVar13;
                  puVar12[1] = puVar13[1];
                  iVar2 = CandidateArcNo;
                }
                *(int *)((long)pvVar11 + (long)iVar2 * 0x10) = minR._0_4_;
                *(undefined4 *)((long)pvVar11 + (long)iVar2 * 0x10 + 4) = d2._4_4_;
                *(double *)((long)pvVar11 + (long)iVar2 * 0x10 + 8) = dStack_22e0;
                iStack_2224 = iStack_2224 + 1;
              }
            }
          }
        }
        if (0 < iStack_2224) {
          for (Which = 0; Which < iStack_2224; Which = Which + 1) {
            iVar2 = *(int *)((long)pvVar11 + (long)Which * 0x10);
            uVar3 = *(undefined4 *)((long)pvVar11 + (long)Which * 0x10 + 4);
            eq.coeff[6]._4_4_ = x._4_4_;
            memcpy(x_00 + x._4_4_,pMVar4[iVar2].x,(long)pMVar4[iVar2].noPixels << 3);
            memcpy(y_00 + x._4_4_,pMVar4[iVar2].y,(long)pMVar4[iVar2].noPixels << 3);
            x._4_4_ = pMVar4[iVar2].noPixels + x._4_4_;
            EllipseEquation::EllipseEquation((EllipseEquation *)&ellipseFitError);
            sTheta = 10000000000.0;
            bVar9 = EllipseFit(x_00,y_00,x._4_4_,(EllipseEquation *)&ellipseFitError,1);
            if (bVar9) {
              sTheta = ComputeEllipseError((EllipseEquation *)&ellipseFitError,x_00,y_00,x._4_4_);
            }
            if (sTheta <= 1.5) {
              bVar8 = true;
              Eq.coeff[6]._7_1_ = 1;
              Eq.coeff[5] = eq.coeff[5];
              Eq.coeff[3] = eq.coeff[3];
              Eq.coeff[4] = eq.coeff[4];
              Eq.coeff[1] = eq.coeff[1];
              Eq.coeff[2] = eq.coeff[2];
              EllipseFitError = ellipseFitError;
              Eq.coeff[0] = eq.coeff[0];
              R = sTheta;
              *(undefined1 *)((long)pvVar10 + (long)iVar2) = 1;
              *(undefined1 *)((long)pvVar10 + (long)local_2228) = 1;
              _NoPixels = (_NoPixels + pMVar4[iVar2].r) * 0.5;
              AngleSet::set((AngleSet *)local_21f8,pMVar4[iVar2].sTheta,pMVar4[iVar2].eTheta);
              SY = x._4_4_;
              switch(uVar3) {
              case 1:
                EX = noPixels;
                EY = local_2290;
                noPixels = pMVar4[iVar2].ex;
                local_2290 = pMVar4[iVar2].ey;
                if (SX == 1) {
                  SX = -1;
                }
                else {
                  SX = 1;
                }
                break;
              case 2:
                EX = noPixels;
                EY = local_2290;
                noPixels = pMVar4[iVar2].sx;
                local_2290 = pMVar4[iVar2].sy;
                if (SX == 1) {
                  SX = -1;
                }
                else {
                  SX = 1;
                }
                break;
              case 3:
                noPixels = pMVar4[iVar2].ex;
                local_2290 = pMVar4[iVar2].ey;
                break;
              case 4:
                noPixels = pMVar4[iVar2].sx;
                local_2290 = pMVar4[iVar2].sy;
              }
              break;
            }
            x._4_4_ = eq.coeff[6]._4_4_;
          }
        }
      } while (bVar8);
      if ((Eq.coeff[6]._7_1_ & 1) == 0) {
        pMVar5 = this->edarcs3->arcs;
        iVar2 = this->edarcs3->noArcs;
        this->edarcs3->noArcs = iVar2 + 1;
        memcpy(pMVar5 + iVar2,pMVar4 + local_2228,0xa8);
      }
      else {
        AngleSet::computeStartEndTheta((AngleSet *)local_21f8,&eTheta,&XC);
        CircleFit(x_00,y_00,SY,&YC,&R_1,&CircleFitError,&coverage);
        dVar17 = ArcLength(eTheta,XC);
        sTheta_00 = eTheta;
        eTheta_00 = XC;
        xc = YC;
        yc = R_1;
        dVar16 = CircleFitError;
        dVar15 = coverage;
        if ((dVar17 / 6.283185307179586 < 0.67) || (1.5 < coverage)) {
          pMVar5 = this->edarcs3->arcs;
          pEVar6 = this->edarcs3;
          iVar2 = pMVar4[local_2228].segmentNo;
          dVar17 = AngleSet::overlapRatio((AngleSet *)local_21f8);
          addArc(pMVar5,&pEVar6->noArcs,xc,yc,dVar16,dVar15,sTheta_00,eTheta_00,SX,iVar2,
                 (EllipseEquation *)&EllipseFitError,R,EX,EY,noPixels,local_2290,x_00,y_00,SY,dVar17
                );
        }
        else {
          addCircle(this->circles1,&this->noCircles1,YC,R_1,CircleFitError,coverage,x_00,y_00,SY);
        }
        BufferManager::move(this->bm,SY);
      }
    }
    local_2228 = local_2228 + 1;
  } while( true );
}

Assistant:

void EDCircles::JoinArcs2()
{
	AngleSet angles;

	// Sort the arcs with respect to their length so that longer arcs are at the beginning
	sortArc(edarcs2->arcs, edarcs2->noArcs);

	int noArcs = edarcs2->noArcs;
	MyArc *arcs = edarcs2->arcs;

	bool *taken = new bool[noArcs];
	for (int i = 0; i<noArcs; i++) taken[i] = false;

	struct CandidateArc {
		int arcNo;
		int which;    // 1: (SX, SY)-(sx, sy), 2: (SX, SY)-(ex, ey), 3: (EX, EY)-(sx, sy), 4: (EX, EY)-(ex, ey)
		double dist;  // min distance between the end points
	};

	CandidateArc *candidateArcs = new CandidateArc[noArcs];
	int noCandidateArcs;

	for (int i = 0; i<noArcs; i++) {
		if (taken[i]) continue;

		// Current arc
		bool EllipseEqValid = false;
		EllipseEquation Eq;
		double EllipseFitError;

		double R = arcs[i].r;
		int Turn = arcs[i].turn;
		int NoPixels = arcs[i].noPixels;

		int SX = arcs[i].sx;
		int SY = arcs[i].sy;
		int EX = arcs[i].ex;
		int EY = arcs[i].ey;

		// Take the pixels making up this arc
		int noPixels = arcs[i].noPixels;

		double *x = bm->getX();
		double *y = bm->getY();
		memcpy(x, arcs[i].x, noPixels * sizeof(double));
		memcpy(y, arcs[i].y, noPixels * sizeof(double));

		angles.clear();
		angles.set(arcs[i].sTheta, arcs[i].eTheta);

		while (1) {
			bool extendedArc = false;

			// Find other arcs to join with
			noCandidateArcs = 0;

			for (int j = i + 1; j<noArcs; j++) {
				if (taken[j]) continue;
				if (arcs[j].segmentNo != arcs[i].segmentNo) continue;
				if (arcs[j].turn != Turn) continue;

				double minR = MIN(R, arcs[j].r);
				double radiusDiffThreshold = minR*2.5;

				double diff = fabs(R - arcs[j].r);
				if (diff > radiusDiffThreshold) continue;

				// If 75% of the current arc overlaps with the existing arc, then ignore this arc
				if (angles.overlap(arcs[j].sTheta, arcs[j].eTheta) >= 0.75) continue;

				// Compute the distances
				// 1: (SX, SY)-(sx, sy)
				double dx = SX - arcs[j].sx;
				double dy = SY - arcs[j].sy;
				double d = sqrt(dx*dx + dy*dy);
				int which = 1;

				// 2: (SX, SY)-(ex, ey)
				dx = SX - arcs[j].ex;
				dy = SY - arcs[j].ey;
				double d2 = sqrt(dx*dx + dy*dy);
				if (d2 < d) { d = d2; which = 2; }

				// 3: (EX, EY)-(sx, sy)
				dx = EX - arcs[j].sx;
				dy = EY - arcs[j].sy;
				d2 = sqrt(dx*dx + dy*dy);
				if (d2 < d) { d = d2; which = 3; }

				// 4: (EX, EY)-(ex, ey)
				dx = EX - arcs[j].ex;
				dy = EY - arcs[j].ey;
				d2 = sqrt(dx*dx + dy*dy);
				if (d2 < d) { d = d2; which = 4; }

				// Endpoints must be very close
				double maxDistanceBetweenEndpoints = 5; //10; 
				if (d > maxDistanceBetweenEndpoints) continue;

				// Add to candidate arcs in sorted order. User insertion sort
				int index = noCandidateArcs - 1;
				while (index >= 0) {
					if (candidateArcs[index].dist < d) break;

					candidateArcs[index + 1] = candidateArcs[index];
					index--;
				} //end-while

				  // Add the new candidate arc to the candidate list
				index++;
				candidateArcs[index].arcNo = j;
				candidateArcs[index].which = which;
				candidateArcs[index].dist = d;
				noCandidateArcs++;
			} //end-for

			  // Try to join the current arc with the candidate arc (if there is one)
			if (noCandidateArcs > 0) {
				for (int j = 0; j<noCandidateArcs; j++) {
					int CandidateArcNo = candidateArcs[j].arcNo;
					int Which = candidateArcs[j].which;

					int noPixelsSave = noPixels;
					memcpy(x + noPixels, arcs[CandidateArcNo].x, arcs[CandidateArcNo].noPixels * sizeof(double));
					memcpy(y + noPixels, arcs[CandidateArcNo].y, arcs[CandidateArcNo].noPixels * sizeof(double));
					noPixels += arcs[CandidateArcNo].noPixels;

					// Directly fit an ellipse
					EllipseEquation eq;
					double ellipseFitError = 1e10;
					if (EllipseFit(x, y, noPixels, &eq)) ellipseFitError = ComputeEllipseError(&eq, x, y, noPixels);

					if (ellipseFitError > ELLIPSE_ERROR) {
						// No match. Continue with the next candidate
						noPixels = noPixelsSave;

					}
					else {
						// Match. Take it
						extendedArc = true;
						EllipseEqValid = true;
						Eq = eq;
						EllipseFitError = ellipseFitError;
						NoPixels = noPixels;

						taken[CandidateArcNo] = true;
						taken[i] = true;

						R = (R + arcs[CandidateArcNo].r) / 2.0;

						angles.set(arcs[CandidateArcNo].sTheta, arcs[CandidateArcNo].eTheta);

						// Update the end points of the new arc
						switch (Which) {
							// (SX, SY)-(sy, sy)
						case 1: SX = EX, SY = EY; EX = arcs[CandidateArcNo].ex; EY = arcs[CandidateArcNo].ey;
							if (Turn == 1) Turn = -1; else Turn = 1; // reverse the turn direction
							break;

							// (SX, SY)-(ex, ey)
						case 2: SX = EX, SY = EY; EX = arcs[CandidateArcNo].sx; EY = arcs[CandidateArcNo].sy;
							if (Turn == 1) Turn = -1; else Turn = 1; // reverse the turn direction
							break;

							// (EX, EY)-(sx, sy)
						case 3: EX = arcs[CandidateArcNo].ex; EY = arcs[CandidateArcNo].ey; break;

							// (EX, EY)-(ex, ey)
						case 4: EX = arcs[CandidateArcNo].sx; EY = arcs[CandidateArcNo].sy; break;
						} //end-switch

						break; // Do not look at the other candidates
					} //end-if
				} //end-for
			} //end-if

			if (extendedArc == false) break;
		} //end-while

		if (EllipseEqValid == false) {
			// Add to arcs
			edarcs3->arcs[edarcs3->noArcs++] = arcs[i];

		}
		else {
			// Add the current OR the extended arc to the new arcs
			double sTheta, eTheta;
			angles.computeStartEndTheta(sTheta, eTheta);

			double XC, YC, R, CircleFitError;
			CircleFit(x, y, NoPixels, &XC, &YC, &R, &CircleFitError);

			double coverage = ArcLength(sTheta, eTheta) / TWOPI;
			if ((coverage >= FULL_CIRCLE_RATIO && CircleFitError <= LONG_ARC_ERROR))
				addCircle(circles1, noCircles1, XC, YC, R, CircleFitError, x, y, NoPixels);
			else
				addArc(edarcs3->arcs, edarcs3->noArcs, XC, YC, R, CircleFitError, sTheta, eTheta, Turn, arcs[i].segmentNo, &Eq, EllipseFitError, SX, SY, EX, EY, x, y, NoPixels, angles.overlapRatio());

			// Move buffer pointers
			bm->move(NoPixels);
		} //end-if
	} //end-for

	delete[] taken;
	delete[] candidateArcs;
}